

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O1

AspifTextOutput * __thiscall
Potassco::AspifTextOutput::push(AspifTextOutput *this,WeightLitSpan *wlits)

{
  WeightLit_t *pWVar1;
  Data *pDVar2;
  iterator iVar3;
  WeightLit_t *pWVar4;
  uint local_34;
  uint local_30;
  uint local_2c;
  
  pDVar2 = this->data_;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&pDVar2->directives,
             ((long)(pDVar2->directives).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(pDVar2->directives).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) + wlits->size * 2);
  pDVar2 = this->data_;
  local_2c = (uint)wlits->size;
  iVar3._M_current =
       (pDVar2->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (pDVar2->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&pDVar2->directives,iVar3,&local_2c);
  }
  else {
    *iVar3._M_current = local_2c;
    (pDVar2->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  if (wlits->size != 0) {
    pWVar4 = wlits->first;
    pWVar1 = pWVar4 + wlits->size;
    do {
      pDVar2 = this->data_;
      local_30 = pWVar4->lit;
      iVar3._M_current =
           (pDVar2->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (pDVar2->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&pDVar2->directives,iVar3,&local_30);
      }
      else {
        *iVar3._M_current = local_30;
        (pDVar2->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
        .super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      pDVar2 = this->data_;
      local_34 = pWVar4->weight;
      iVar3._M_current =
           (pDVar2->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (pDVar2->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&pDVar2->directives,iVar3,&local_34);
      }
      else {
        *iVar3._M_current = local_34;
        (pDVar2->directives).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
        .super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      pWVar4 = pWVar4 + 1;
    } while (pWVar4 != pWVar1);
  }
  return this;
}

Assistant:

AspifTextOutput& AspifTextOutput::push(const WeightLitSpan& wlits) {
	data_->directives.reserve(data_->directives.size() + (2*size(wlits)));
	data_->directives.push_back(static_cast<uint32_t>(size(wlits)));
	for (WeightLitSpan::iterator it = begin(wlits), end = Potassco::end(wlits); it != end; ++it) {
		data_->directives.push_back(static_cast<uint32_t>(lit(*it)));
		data_->directives.push_back(static_cast<uint32_t>(weight(*it)));
	}
	return *this;
}